

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nes_system.c
# Opt level: O0

void ppu_mem_rw(nes_system *system)

{
  uint8_t uVar1;
  ushort address_00;
  uint16_t uVar2;
  uint16_t address;
  nes_mapper *mapper;
  nes_system_state *state;
  nes_system *system_local;
  
  address_00 = (system->state).ppu.vram_address & 0x3fff;
  if (((byte)(system->state).ppu.field_0xa >> 3 & 1) == 0) {
    if ((system->config).memory_callback !=
        (_func_void_nes_memory_type_nes_memory_op_uint16_t_uint8_t_ptr_void_ptr *)0x0) {
      (*(system->config).memory_callback)
                (NES_MEMORY_TYPE_PPU,NES_MEMORY_OP_WRITE,(system->state).ppu.vram_address,
                 &(system->state).ppu.vram_data,(system->config).client_data);
    }
    if (address_00 < 0x2000) {
      if (system->cartridge->chr_rom_size <= (ulong)address_00) {
        (system->state).chr_ram[address_00] = (system->state).ppu.vram_data;
      }
    }
    else {
      uVar2 = get_ppu_nametable_address(system,address_00);
      (system->state).vram[uVar2] = (system->state).ppu.vram_data;
    }
  }
  else {
    if (address_00 < 0x2000) {
      if ((ulong)address_00 < system->cartridge->chr_rom_size) {
        uVar1 = (*system->cartridge->mapper->read_chr)(system->cartridge,address_00);
        (system->state).ppu.vram_data = uVar1;
      }
      else {
        (system->state).ppu.vram_data = (system->state).chr_ram[address_00];
      }
    }
    else {
      uVar2 = get_ppu_nametable_address(system,address_00);
      (system->state).ppu.vram_data = (system->state).vram[uVar2];
    }
    if ((system->config).memory_callback !=
        (_func_void_nes_memory_type_nes_memory_op_uint16_t_uint8_t_ptr_void_ptr *)0x0) {
      (*(system->config).memory_callback)
                (NES_MEMORY_TYPE_PPU,NES_MEMORY_OP_READ,(system->state).ppu.vram_address,
                 &(system->state).ppu.vram_data,(system->config).client_data);
    }
  }
  return;
}

Assistant:

static void ppu_mem_rw(nes_system* system)
{
    nes_system_state* state = &system->state;
    nes_mapper* mapper = system->cartridge->mapper;

    uint16_t address = state->ppu.vram_address & 0x3FFF;

    if (state->ppu.r)
    {
        if (address < 0x2000)
        {
            if (system->cartridge->chr_rom_size > address)
            {
                state->ppu.vram_data = mapper->read_chr(system->cartridge, address);
            }
            else
            {
                state->ppu.vram_data = state->chr_ram[address];
            }
        }
        else
        {
            address = get_ppu_nametable_address(system, address);
            state->ppu.vram_data = state->vram[address];
        }

        if (system->config.memory_callback)
            system->config.memory_callback(NES_MEMORY_TYPE_PPU, NES_MEMORY_OP_READ, state->ppu.vram_address, &state->ppu.vram_data, system->config.client_data);
    }
    else
    {
        if (system->config.memory_callback)
            system->config.memory_callback(NES_MEMORY_TYPE_PPU, NES_MEMORY_OP_WRITE, state->ppu.vram_address, &state->ppu.vram_data, system->config.client_data);

        if (address < 0x2000)
        {
            if (system->cartridge->chr_rom_size <= address)
                state->chr_ram[address] = state->ppu.vram_data;
        }
        else
        {
            address = get_ppu_nametable_address(system, address);
            state->vram[address] = state->ppu.vram_data;
        }
    }
}